

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# representation.cpp
# Opt level: O0

bool IfProtected(int player,int to,Situation *situation,int exp)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint in_ECX;
  long in_RDX;
  uint in_ESI;
  int in_EDI;
  int from_id;
  int i_5;
  int i_4;
  int to_row;
  int to_col;
  int from_row;
  int from_col;
  int horse_leg;
  int i_3;
  int from_id_1;
  int i_2;
  int i_1;
  int i;
  int from;
  int player_flag;
  int local_54;
  int local_50;
  int in_stack_ffffffffffffffb4;
  int local_38;
  int local_30;
  uint local_2c;
  uint local_28;
  uint local_24;
  bool local_1;
  
  uVar2 = GetPlayerFlag(in_EDI);
  if ((*(char *)(in_RDX + 4 + (long)(int)in_ESI) == '\0') ||
     (iVar3 = ColorOfPiece(in_stack_ffffffffffffffb4), iVar3 == in_EDI)) {
    bVar1 = InHomeHalf(in_ESI,in_EDI);
    local_28 = uVar2;
    if (bVar1) {
      for (; local_2c = uVar2, (int)local_28 <= (int)uVar2; local_28 = local_28 + 1) {
        local_24 = (uint)*(byte *)(in_RDX + 0x104 + (long)(int)local_28);
        if ((((local_24 != 0) && ((LEGAL_POSITION[in_EDI][(int)in_ESI] & 2) != 0)) &&
            (""[(int)((in_ESI - local_24) + 0x100)] == '\x01')) && (local_24 != in_ECX)) {
          return true;
        }
      }
      while (local_2c = local_2c + 1, (int)local_2c <= (int)(uVar2 + 2)) {
        local_24 = (uint)*(byte *)(in_RDX + 0x104 + (long)(int)local_2c);
        if (((local_24 != 0) && ((LEGAL_POSITION[in_EDI][(int)in_ESI] & 4) != 0)) &&
           ((""[(int)((in_ESI - local_24) + 0x100)] == '\x02' && (local_24 != in_ECX)))) {
          return true;
        }
      }
      for (local_30 = uVar2 + 3; local_30 <= (int)(uVar2 + 4); local_30 = local_30 + 1) {
        local_24 = (uint)*(byte *)(in_RDX + 0x104 + (long)local_30);
        if (((local_24 != 0) && ((LEGAL_POSITION[in_EDI][(int)in_ESI] & 0x10) != 0)) &&
           ((""[(int)((in_ESI - local_24) + 0x100)] == '\x03' &&
            ((*(char *)(in_RDX + 4 + (long)((int)(in_ESI + local_24) >> 1)) == '\0' &&
             (local_24 != in_ECX)))))) {
          return true;
        }
      }
    }
    else {
      for (local_24 = in_ESI - 1; (int)local_24 <= (int)(in_ESI + 1); local_24 = local_24 + 2) {
        uVar7 = (uint)*(byte *)(in_RDX + 4 + (long)(int)local_24);
        if ((((uVar7 & uVar2) != 0) && (10 < (uVar7 & 0xf))) && (local_24 != in_ECX)) {
          return true;
        }
      }
    }
    for (local_38 = uVar2 + 5; local_38 <= (int)(uVar2 + 6); local_38 = local_38 + 1) {
      local_24 = (uint)*(byte *)(in_RDX + 0x104 + (long)local_38);
      if (((local_24 != 0) &&
          (HORSE_LEGAL_MOVE[(int)((in_ESI - local_24) + 0x100)] + local_24 != local_24)) &&
         ((*(char *)(in_RDX + 4 +
                    (long)(int)(HORSE_LEGAL_MOVE[(int)((in_ESI - local_24) + 0x100)] + local_24)) ==
           '\0' && (local_24 != in_ECX)))) {
        return true;
      }
    }
    GetCol(local_24);
    GetRow(local_24);
    iVar3 = GetCol(in_ESI);
    iVar4 = GetRow(in_ESI);
    for (local_50 = uVar2 + 7; local_50 <= (int)(uVar2 + 8); local_50 = local_50 + 1) {
      uVar7 = (uint)*(byte *)(in_RDX + 0x104 + (long)local_50);
      iVar5 = GetCol(uVar7);
      iVar6 = GetRow(uVar7);
      if ((uVar7 != 0) && (uVar7 != in_ESI)) {
        if (iVar6 == iVar4) {
          if (((*(ushort *)
                 ((long)(iVar5 + -3) * 0x1000 + 0x330d82 +
                 (ulong)*(ushort *)(in_RDX + 0x134 + (long)iVar6 * 2) * 8) &
               BIT_ROW_MASK[(int)in_ESI]) != 0) && (uVar7 != in_ECX)) {
            return true;
          }
        }
        else if (((iVar5 == iVar3) &&
                 ((*(ushort *)
                    ((long)(iVar6 + -3) * 0x2000 + 0x339d82 +
                    (ulong)*(ushort *)(in_RDX + 0x154 + (long)iVar5 * 2) * 8) &
                  BIT_COL_MASK[(int)in_ESI]) != 0)) && (uVar7 != in_ECX)) {
          return true;
        }
      }
    }
    for (local_54 = uVar2 + 9; local_54 <= (int)(uVar2 + 10); local_54 = local_54 + 1) {
      uVar7 = (uint)*(byte *)(in_RDX + 0x104 + (long)local_54);
      iVar5 = GetCol(uVar7);
      iVar6 = GetRow(uVar7);
      if ((uVar7 != 0) && (uVar7 != in_ESI)) {
        if (iVar6 == iVar4) {
          if (((*(ushort *)
                 ((long)(iVar5 + -3) * 0x1000 + 0x330d84 +
                 (ulong)*(ushort *)(in_RDX + 0x134 + (long)iVar6 * 2) * 8) &
               BIT_ROW_MASK[(int)in_ESI]) != 0) && (uVar7 != in_ECX)) {
            return true;
          }
        }
        else if (((iVar5 == iVar3) &&
                 ((*(ushort *)
                    ((long)(iVar6 + -3) * 0x2000 + 0x339d84 +
                    (ulong)*(ushort *)(in_RDX + 0x154 + (long)iVar5 * 2) * 8) &
                  BIT_COL_MASK[(int)in_ESI]) != 0)) && (uVar7 != in_ECX)) {
          return true;
        }
      }
    }
    uVar7 = SquareBack(in_ESI,in_EDI);
    uVar8 = (uint)*(byte *)(in_RDX + 4 + (long)(int)uVar7);
    if ((((uVar8 & uVar2) == 0) || ((uVar8 & 0xf) < 0xb)) || (uVar7 == in_ECX)) {
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool IfProtected(int player, const int to, const Situation & situation, int exp){
    // 对手的player_flag
    int player_flag = GetPlayerFlag(player);

    // 对手的棋子所在的位置，即判断保护的from
    int from;
    if(situation.current_board[to] != 0 && ColorOfPiece(situation.current_board[to]) != player) 
        return false;
    
    // 是否过河
    if(InHomeHalf(to, player)){
        // 被将(帅)保护
        for(int i = player_flag + 0; i <= player_flag + 0; i ++){
            from = situation.current_pieces[i];
            if (from && (LEGAL_POSITION[player][to] & POSITION_MASK[0]) && (LEGAL_MOVE[to - from + 256] == 1) && from != exp)
                return true;
        }

        // 被士(仕)保护
        for(int i = player_flag + 1; i <= player_flag + 2; i ++){
            from = situation.current_pieces[i];
            if (from && (LEGAL_POSITION[player][to] & POSITION_MASK[1]) && (LEGAL_MOVE[to - from + 256] == 2) && from != exp)
                return true;
        }

        // 被象(相)保护
        for(int i = player_flag + 3; i <= player_flag + 4; i ++){
            from = situation.current_pieces[i];
            if(from && (LEGAL_POSITION[player][to] & POSITION_MASK[2]) && (LEGAL_MOVE[to - from + 256] == 3) && (situation.current_board[(to + from) >> 1] == 0) && from != exp)
                return true;
        }
    }
    else{
        // 被兵保护(横向)
        for(from = to - 1; from <= to + 1; from += 2){
            int from_id = situation.current_board[from];
            if(((from_id & player_flag) != 0) && ((from_id & 15) >= 11) && from != exp)
                return true;
        }
    }

    // 被马保护
    for(int i = player_flag + 5; i <= player_flag + 6; i ++){
        from = situation.current_pieces[i];
        int horse_leg = HORSE_LEGAL_MOVE[to - from + 256] + from;
        if(from && horse_leg != from && situation.current_board[horse_leg] == 0 && from != exp)
            return true;
    }

    int from_col = GetCol(from), from_row = GetRow(from), to_col = GetCol(to), to_row = GetRow(to);

    // 被车保护
    for(int i = player_flag + 7; i <= player_flag + 8; i ++){
        from = situation.current_pieces[i];
        from_col = GetCol(from);
        from_row = GetRow(from);
        if(from && from != to){
            if(from_row == to_row){
                if((ROOK_CANNON_CAN_GET_ROW_MASK[from_col - 3][situation.bit_row[from_row]].rook_capture & BIT_ROW_MASK[to]) != 0 && from != exp)
                    return true;
            }
            else if(from_col == to_col){
                if((ROOK_CANNON_CAN_GET_COL_MASK[from_row - 3][situation.bit_col[from_col]].rook_capture & BIT_COL_MASK[to]) != 0 && from != exp)
                    return true;
            }
        }
    }

    // 被炮保护
    for(int i = player_flag + 9; i <= player_flag + 10; i ++){
        from = situation.current_pieces[i];
        from_col = GetCol(from);
        from_row = GetRow(from);
        if(from && from != to){
            if(from_row == to_row){
                if((ROOK_CANNON_CAN_GET_ROW_MASK[from_col - 3][situation.bit_row[from_row]].cannon_capture & BIT_ROW_MASK[to]) != 0 && from != exp)
                    return true;
            }
            else if(from_col == to_col){
                if((ROOK_CANNON_CAN_GET_COL_MASK[from_row - 3][situation.bit_col[from_col]].cannon_capture & BIT_COL_MASK[to]) != 0 && from != exp)
                    return true;
            }
        }
    }

    // 被兵保护(纵向)
    from = SquareBack(to, player);
    int from_id = situation.current_board[from];
    if(((from_id & player_flag) != 0) && ((from_id & 15) >= 11) && from != exp)
        return true;

    return false;
}